

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O2

void AArch64_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  ushort uVar2;
  cs_struct *pcVar3;
  cs_detail *pcVar4;
  _Bool _Var5;
  uint uVar6;
  cs_ac_type cVar7;
  uint uVar8;
  arm64_reg aVar9;
  MCOperand *pMVar10;
  MCOperand *pMVar11;
  MCOperand *pMVar12;
  MCOperand *pMVar13;
  int64_t iVar14;
  int64_t iVar15;
  ulong uVar16;
  int64_t iVar17;
  long lVar18;
  char *pcVar19;
  int iVar20;
  undefined *puVar21;
  uint uVar22;
  char *pcVar23;
  char *AsmStrs_3;
  uint16_t *RegAsmOffset_1;
  int iVar24;
  char *AsmStrs;
  uint uVar25;
  int iVar26;
  uint16_t *RegAsmOffset;
  uint local_68;
  
  uVar6 = MCInst_getOpcode(MI);
  if (uVar6 != 0x7c4) {
    if ((uVar6 - 0x820 < 2) || (uVar6 - 0x502 < 2)) {
      local_68 = uVar6 & 0xfffffffe;
      pMVar10 = MCInst_getOperand(MI,0);
      pMVar11 = MCInst_getOperand(MI,1);
      pMVar12 = MCInst_getOperand(MI,2);
      pMVar13 = MCInst_getOperand(MI,3);
      _Var5 = MCOperand_isImm(pMVar12);
      if ((_Var5) &&
         ((iVar14 = MCOperand_getImm(pMVar12), iVar14 == 0 &&
          (_Var5 = MCOperand_isImm(pMVar13), _Var5)))) {
        iVar14 = MCOperand_getImm(pMVar13);
        if (iVar14 == 0x1f) {
          if (((uVar6 == 0x821) || (uVar6 == 0x503)) && (local_68 == 0x502)) {
            pcVar19 = "sxtw";
            goto LAB_001e64ec;
          }
        }
        else {
          if (iVar14 == 0xf) {
            pcVar23 = "sxth";
            pcVar19 = "uxth";
          }
          else {
            if (iVar14 != 7) goto LAB_001e66a0;
            pcVar23 = "sxtb";
            pcVar19 = "uxtb";
          }
          if (local_68 == 0x502) {
            pcVar19 = pcVar23;
          }
          if (local_68 == 0x502 || uVar6 != 0x821) {
LAB_001e64ec:
            uVar6 = MCOperand_getReg(pMVar10);
            uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2);
            uVar6 = MCOperand_getReg(pMVar11);
            uVar6 = getWRegFromXReg(uVar6);
            SStream_concat(O,"%s\t%s, %s",pcVar19,getRegisterName_AsmStrsNoRegAltName + uVar2,
                           getRegisterName_AsmStrsNoRegAltName +
                           *(ushort *)
                            (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2));
            pcVar3 = MI->csh;
            if (pcVar3->detail != CS_OPT_OFF) {
              uVar6 = MCInst_getOpcode(MI);
              cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
              pcVar4 = MI->flat_insn->detail;
              pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
              MI->ac_idx = MI->ac_idx + '\x01';
              pcVar4 = MI->flat_insn->detail;
              puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
              puVar1[0] = '\x01';
              puVar1[1] = '\0';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              uVar6 = MCOperand_getReg(pMVar10);
              pcVar4 = MI->flat_insn->detail;
              *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
                   uVar6;
              puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
              *puVar1 = *puVar1 + '\x01';
              pcVar3 = MI->csh;
              uVar6 = MCInst_getOpcode(MI);
              cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
              pcVar4 = MI->flat_insn->detail;
              pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
              MI->ac_idx = MI->ac_idx + '\x01';
              pcVar4 = MI->flat_insn->detail;
              puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
              puVar1[0] = '\x01';
              puVar1[1] = '\0';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              uVar6 = MCOperand_getReg(pMVar11);
              uVar6 = getWRegFromXReg(uVar6);
              pcVar4 = MI->flat_insn->detail;
              *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
                   uVar6;
              puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
              *puVar1 = *puVar1 + '\x01';
            }
            aVar9 = AArch64_map_insn(pcVar19);
            MCInst_setOpcodePub(MI,aVar9);
            return;
          }
        }
      }
LAB_001e66a0:
      _Var5 = MCOperand_isImm(pMVar12);
      if ((_Var5) && (_Var5 = MCOperand_isImm(pMVar13), _Var5)) {
        iVar14 = MCOperand_getImm(pMVar12);
        iVar15 = MCOperand_getImm(pMVar13);
        uVar8 = (uint)iVar15;
        uVar25 = (uint)iVar14;
        uVar22 = uVar8 + 1 ^ uVar25;
        if (((uVar6 ^ 0x820) == 0 && uVar22 == 0) && uVar8 != 0x1f) {
          iVar26 = 0x1f;
LAB_001e672a:
          uVar25 = iVar26 - uVar8;
          pcVar19 = "lsl";
        }
        else {
          if ((uVar22 == 0 && (uVar6 ^ 0x821) == 0) && uVar8 != 0x3f) {
            iVar26 = 0x3f;
            goto LAB_001e672a;
          }
          pcVar19 = "lsr";
          if (((uVar6 ^ 0x820) != 0 || (uVar8 ^ 0x1f) != 0) &&
             ((uVar6 ^ 0x821) != 0 || (uVar8 ^ 0x3f) != 0)) {
            pcVar19 = "asr";
            if ((uVar6 != 0x502 || (uVar8 ^ 0x1f) != 0) && (uVar6 != 0x503 || (uVar8 ^ 0x3f) != 0))
            goto LAB_001e6afa;
          }
        }
        uVar6 = MCOperand_getReg(pMVar10);
        uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2);
        uVar6 = MCOperand_getReg(pMVar11);
        SStream_concat(O,"%s\t%s, %s, ",pcVar19,getRegisterName_AsmStrsNoRegAltName + uVar2,
                       getRegisterName_AsmStrsNoRegAltName +
                       *(ushort *)
                        (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2));
        printInt32Bang(O,uVar25);
        aVar9 = AArch64_map_insn(pcVar19);
        MCInst_setOpcodePub(MI,aVar9);
        pcVar3 = MI->csh;
        if (pcVar3->detail == CS_OPT_OFF) {
          return;
        }
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar10);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar3 = MI->csh;
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar11);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar3 = MI->csh;
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        lVar18 = (long)(int)uVar25;
        goto LAB_001e6e39;
      }
LAB_001e6afa:
      iVar14 = MCOperand_getImm(pMVar12);
      iVar15 = MCOperand_getImm(pMVar13);
      uVar8 = MCOperand_getReg(pMVar10);
      uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2);
      uVar8 = MCOperand_getReg(pMVar11);
      if (iVar15 < iVar14) {
        pcVar19 = "ubfiz";
        if (local_68 == 0x502) {
          pcVar19 = "sbfiz";
        }
        SStream_concat(O,"%s\t%s, %s, ",pcVar19,getRegisterName_AsmStrsNoRegAltName + uVar2,
                       getRegisterName_AsmStrsNoRegAltName +
                       *(ushort *)
                        (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2));
        iVar26 = (uint)(uVar6 == 0x503 || uVar6 == 0x821) * 0x20 + 0x20;
        iVar14 = MCOperand_getImm(pMVar12);
        printInt32Bang(O,iVar26 - (int)iVar14);
        SStream_concat0(O,", ");
        iVar14 = MCOperand_getImm(pMVar13);
        printInt32Bang(O,(int)iVar14 + 1);
        aVar9 = AArch64_map_insn(pcVar19);
        MCInst_setOpcodePub(MI,aVar9);
        pcVar3 = MI->csh;
        if (pcVar3->detail == CS_OPT_OFF) {
          return;
        }
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar10);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar3 = MI->csh;
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar11);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar3 = MI->csh;
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        iVar14 = MCOperand_getImm(pMVar12);
        pcVar4 = MI->flat_insn->detail;
        *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
             (long)(iVar26 - (int)iVar14);
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar3 = MI->csh;
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        iVar14 = MCOperand_getImm(pMVar13);
        lVar18 = iVar14 + 1;
        goto LAB_001e6e39;
      }
      pcVar19 = "ubfx";
      if (local_68 == 0x502) {
        pcVar19 = "sbfx";
      }
      SStream_concat(O,"%s\t%s, %s, ",pcVar19,getRegisterName_AsmStrsNoRegAltName + uVar2,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2))
      ;
      iVar14 = MCOperand_getImm(pMVar12);
      printInt32Bang(O,(int32_t)iVar14);
      SStream_concat0(O,", ");
      iVar14 = MCOperand_getImm(pMVar13);
      iVar15 = MCOperand_getImm(pMVar12);
      printInt32Bang(O,((int)iVar14 - (int)iVar15) + 1);
      aVar9 = AArch64_map_insn(pcVar19);
      MCInst_setOpcodePub(MI,aVar9);
      pcVar3 = MI->csh;
      if (pcVar3->detail == CS_OPT_OFF) {
        return;
      }
      uVar6 = MCInst_getOpcode(MI);
      cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar6 = MCOperand_getReg(pMVar10);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar3 = MI->csh;
      uVar6 = MCInst_getOpcode(MI);
      cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar6 = MCOperand_getReg(pMVar11);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar3 = MI->csh;
      uVar6 = MCInst_getOpcode(MI);
      cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      iVar14 = MCOperand_getImm(pMVar12);
      pcVar4 = MI->flat_insn->detail;
      *(int64_t *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = iVar14;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar3 = MI->csh;
      uVar6 = MCInst_getOpcode(MI);
      cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      iVar14 = MCOperand_getImm(pMVar13);
      iVar15 = MCOperand_getImm(pMVar12);
      pcVar4 = MI->flat_insn->detail;
      *(int64_t *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
           (iVar14 - iVar15) + 1;
    }
    else {
      if ((uVar6 & 0xfffffffe) != 0x68) goto switchD_001e5b13_caseD_2;
      pMVar10 = MCInst_getOperand(MI,0);
      pMVar11 = MCInst_getOperand(MI,2);
      pMVar12 = MCInst_getOperand(MI,3);
      iVar14 = MCOperand_getImm(pMVar12);
      pMVar12 = MCInst_getOperand(MI,4);
      iVar15 = MCOperand_getImm(pMVar12);
      iVar26 = (int)iVar15;
      iVar24 = (int)iVar14;
      if (iVar26 < iVar24) {
        iVar20 = (uint)(uVar6 == 0x69) * 0x20 + 0x20;
        iVar20 = (iVar20 - iVar24) % iVar20;
        uVar6 = MCOperand_getReg(pMVar10);
        uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2);
        uVar6 = MCOperand_getReg(pMVar11);
        SStream_concat(O,"bfi\t%s, %s, ",getRegisterName_AsmStrsNoRegAltName + uVar2,
                       getRegisterName_AsmStrsNoRegAltName +
                       *(ushort *)
                        (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2));
        printInt32Bang(O,iVar20);
        SStream_concat0(O,", ");
        printInt32Bang(O,iVar26 + 1);
        aVar9 = AArch64_map_insn("bfi");
        MCInst_setOpcodePub(MI,aVar9);
        pcVar3 = MI->csh;
        if (pcVar3->detail == CS_OPT_OFF) {
          return;
        }
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar10);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar3 = MI->csh;
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar11);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar3 = MI->csh;
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar4 = MI->flat_insn->detail;
        *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
             (long)iVar20;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar3 = MI->csh;
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        lVar18 = (long)(iVar26 + 1);
      }
      else {
        iVar26 = (iVar26 - iVar24) + 1;
        uVar6 = MCOperand_getReg(pMVar10);
        uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2);
        uVar6 = MCOperand_getReg(pMVar11);
        SStream_concat(O,"bfxil\t%s, %s, ",getRegisterName_AsmStrsNoRegAltName + uVar2,
                       getRegisterName_AsmStrsNoRegAltName +
                       *(ushort *)
                        (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2));
        printInt32Bang(O,iVar24);
        SStream_concat0(O,", ");
        printInt32Bang(O,iVar26);
        aVar9 = AArch64_map_insn("bfxil");
        MCInst_setOpcodePub(MI,aVar9);
        pcVar3 = MI->csh;
        if (pcVar3->detail == CS_OPT_OFF) {
          return;
        }
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar10);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar3 = MI->csh;
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar11);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar3 = MI->csh;
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar4 = MI->flat_insn->detail;
        *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
             (long)iVar24;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar3 = MI->csh;
        uVar6 = MCInst_getOpcode(MI);
        cVar7 = get_op_access(pcVar3,uVar6,(uint)MI->ac_idx);
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        lVar18 = (long)iVar26;
      }
LAB_001e6e39:
      pcVar4 = MI->flat_insn->detail;
      *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = lVar18;
    }
    goto LAB_001e743b;
  }
  pMVar10 = MCInst_getOperand(MI,0);
  uVar8 = 1;
  pMVar11 = MCInst_getOperand(MI,1);
  pMVar12 = MCInst_getOperand(MI,2);
  pMVar13 = MCInst_getOperand(MI,3);
  iVar14 = MCOperand_getImm(pMVar10);
  iVar15 = MCOperand_getImm(pMVar11);
  uVar16 = MCOperand_getImm(pMVar12);
  iVar17 = MCOperand_getImm(pMVar13);
  iVar26 = (int)iVar14;
  uVar22 = (uint)iVar17;
  uVar6 = uVar22;
  if ((int)iVar15 == 8) {
    switch(uVar16 & 0xffffffff) {
    case 0:
      if (iVar26 != 4) goto switchD_001e5b13_caseD_2;
      uVar8 = 0;
      uVar25 = 0x1c3;
      if (uVar22 == 1) {
        iVar24 = 0xf;
        pcVar19 = "tlbi\tipas2e1is";
      }
      else {
        if (uVar22 != 5) goto switchD_001e5b13_caseD_2;
        iVar24 = 0x10;
        pcVar19 = "tlbi\tipas2le1is";
      }
      break;
    default:
      goto switchD_001e5b13_caseD_2;
    case 3:
      if (iVar26 == 6) {
        uVar25 = 0x1c3;
        if (uVar22 == 0) {
          iVar24 = 0xc;
          pcVar19 = "tlbi\talle3is";
LAB_001e7283:
          uVar25 = 0x1c3;
          uVar8 = uVar22;
          goto LAB_001e729d;
        }
        if (uVar22 == 5) {
          iVar24 = 0xe;
          uVar8 = 0;
          pcVar19 = "tlbi\tvale3is";
        }
        else {
          if (uVar22 != 1) goto switchD_001e5b13_caseD_2;
          iVar24 = 0xd;
          uVar8 = 0;
          pcVar19 = "tlbi\tvae3is";
        }
      }
      else {
        if (iVar26 == 4) {
          if ((6 < uVar22) || ((0x73U >> (uVar22 & 0x1f) & 1) == 0)) goto switchD_001e5b13_caseD_2;
          uVar16 = (ulong)((uVar22 & 7) << 2);
          pcVar19 = &DAT_0036d488 + *(int *)(&DAT_0036d488 + uVar16);
          puVar21 = &DAT_0036d4a4;
        }
        else {
          if (((iVar26 != 0) || (7 < uVar22)) || ((0xafU >> (uVar22 & 0x1f) & 1) == 0))
          goto switchD_001e5b13_caseD_2;
          uVar16 = (ulong)((uVar22 & 7) << 2);
          pcVar19 = &DAT_0036d468 + *(int *)(&DAT_0036d468 + uVar16);
          puVar21 = &DAT_0036ef48;
        }
LAB_001e6a84:
        iVar24 = *(int *)(puVar21 + uVar16);
        uVar8 = 0;
        uVar25 = 0x1c3;
      }
      break;
    case 4:
      if (iVar26 != 4) goto switchD_001e5b13_caseD_2;
      uVar8 = 0;
      uVar25 = 0x1c3;
      if (uVar22 == 1) {
        iVar24 = 0x11;
        pcVar19 = "tlbi\tipas2e1";
      }
      else {
        if (uVar22 != 5) goto switchD_001e5b13_caseD_2;
        iVar24 = 0x12;
        pcVar19 = "tlbi\tipas2le1";
      }
      break;
    case 7:
      if (iVar26 != 6) {
        if (iVar26 == 4) {
          if ((6 < uVar22) || ((0x73U >> (uVar22 & 0x1f) & 1) == 0)) goto switchD_001e5b13_caseD_2;
          uVar16 = (ulong)((uVar22 & 7) << 2);
          pcVar19 = &DAT_0036d4e0 + *(int *)(&DAT_0036d4e0 + uVar16);
          puVar21 = &DAT_0036d4fc;
        }
        else {
          if (((iVar26 != 0) || (7 < uVar22)) || ((0xafU >> (uVar22 & 0x1f) & 1) == 0))
          goto switchD_001e5b13_caseD_2;
          uVar16 = (ulong)((uVar22 & 7) << 2);
          pcVar19 = &DAT_0036d4c0 + *(int *)(&DAT_0036d4c0 + uVar16);
          puVar21 = &DAT_0036ef68;
        }
        goto LAB_001e6a84;
      }
      uVar25 = 0x1c3;
      if (uVar22 == 0) {
        iVar24 = 0x1e;
        pcVar19 = "tlbi\talle3";
        goto LAB_001e7283;
      }
      if (uVar22 == 5) {
        iVar24 = 0x20;
        uVar8 = 0;
        pcVar19 = "tlbi\tvale3";
      }
      else {
        if (uVar22 != 1) goto switchD_001e5b13_caseD_2;
        iVar24 = 0x1f;
        uVar8 = 0;
        pcVar19 = "tlbi\tvae3";
      }
    }
    goto LAB_001e726c;
  }
  if ((int)iVar15 != 7) {
switchD_001e5b13_caseD_2:
    pcVar19 = printAliasInstr(MI,O,Info);
    if (pcVar19 == (char *)0x0) {
      printInstruction(MI,O,(MCRegisterInfo *)Info);
      return;
    }
    aVar9 = AArch64_map_insn(pcVar19);
    MCInst_setOpcodePub(MI,aVar9);
    (*cs_mem_free)(pcVar19);
    return;
  }
  switch((int)uVar16) {
  case 1:
    if (iVar26 != 0 || uVar22 != 0) goto switchD_001e5b13_caseD_2;
    iVar24 = 0;
    uVar8 = 1;
    uVar25 = 0x1c0;
    pcVar19 = "ic\tialluis";
    goto LAB_001e726c;
  default:
    goto switchD_001e5b13_caseD_2;
  case 4:
    if (uVar22 != 1 || iVar26 != 3) goto switchD_001e5b13_caseD_2;
    pcVar19 = "dc\tzva";
    break;
  case 5:
    iVar24 = 0;
    uVar25 = 0x1c0;
    if (iVar26 == 0 && uVar22 == 0) {
      uVar8 = 2;
      pcVar19 = "ic\tiallu";
    }
    else {
      if (uVar22 != 1 || iVar26 != 3) goto switchD_001e5b13_caseD_2;
      uVar8 = 3;
      pcVar19 = "ic\tivau";
    }
LAB_001e726c:
    uVar6 = 0;
LAB_001e726f:
    uVar22 = uVar8;
    uVar8 = 0;
    goto LAB_001e729d;
  case 6:
    uVar25 = 0x1c1;
    if (uVar22 == 2 && iVar26 == 0) {
      pcVar19 = "dc\tisw";
      uVar8 = 3;
    }
    else {
      if (iVar26 != 0 || uVar22 != 1) goto switchD_001e5b13_caseD_2;
      pcVar19 = "dc\tivac";
      uVar8 = 2;
    }
    iVar24 = 0;
    uVar22 = 0;
    uVar6 = 0;
    goto LAB_001e729d;
  case 8:
    if (iVar26 == 6) {
      uVar25 = 0x1c2;
      if (uVar22 != 0) {
        if (uVar22 != 1) goto switchD_001e5b13_caseD_2;
        uVar6 = 0xb;
        pcVar19 = "at\ts1e3w";
        goto LAB_001e71d3;
      }
      pcVar19 = "at\ts1e3r";
      iVar24 = 0;
      uVar6 = 10;
      uVar8 = uVar22;
      goto LAB_001e729d;
    }
    if (iVar26 == 4) {
      if ((7 < uVar22) || ((0xf3U >> (uVar22 & 0x1f) & 1) == 0)) goto switchD_001e5b13_caseD_2;
      uVar6 = (uVar22 & 7) << 2;
      pcVar19 = &DAT_0036d448 + *(int *)(&DAT_0036d448 + uVar6);
      uVar6 = *(uint *)(&DAT_0036ef28 + uVar6);
LAB_001e71d3:
      uVar8 = 0;
      uVar25 = 0x1c2;
      iVar24 = 0;
    }
    else {
      if ((iVar26 != 0) || (3 < uVar22)) goto switchD_001e5b13_caseD_2;
      pcVar19 = &DAT_0036d438 + *(int *)(&DAT_0036d438 + (ulong)(uVar22 & 3) * 4);
      uVar8 = 0;
      uVar25 = 0x1c2;
      iVar24 = 0;
    }
    goto LAB_001e726f;
  case 10:
    if (uVar22 == 1 && iVar26 == 3) {
      uVar8 = 4;
      pcVar19 = "dc\tcvac";
    }
    else {
      if (iVar26 != 0 || uVar22 != 2) goto switchD_001e5b13_caseD_2;
      uVar8 = 5;
      pcVar19 = "dc\tcsw";
    }
    break;
  case 0xb:
    if (uVar22 != 1 || iVar26 != 3) goto switchD_001e5b13_caseD_2;
    uVar8 = 6;
    pcVar19 = "dc\tcvau";
    break;
  case 0xe:
    if (uVar22 == 1 && iVar26 == 3) {
      uVar8 = 7;
      pcVar19 = "dc\tcivac";
    }
    else {
      if (iVar26 != 0 || uVar22 != 2) goto switchD_001e5b13_caseD_2;
      uVar8 = 8;
      pcVar19 = "dc\tcisw";
    }
  }
  uVar25 = 0x1c1;
  iVar24 = 0;
  uVar22 = 0;
  uVar6 = 0;
LAB_001e729d:
  MCInst_setOpcodePub(MI,uVar25);
  SStream_concat0(O,pcVar19);
  pcVar3 = MI->csh;
  if (pcVar3->detail != CS_OPT_OFF) {
    uVar25 = MCInst_getOpcode(MI);
    cVar7 = get_op_access(pcVar3,uVar25,(uint)MI->ac_idx);
    pcVar4 = MI->flat_insn->detail;
    pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
    MI->ac_idx = MI->ac_idx + '\x01';
    pcVar4 = MI->flat_insn->detail;
    puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar1[0] = 'D';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar4 = MI->flat_insn->detail;
    *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
         uVar6 + uVar8 + iVar24 + uVar22;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
  }
  pcVar19 = strstr(pcVar19,"all");
  if (pcVar19 == (char *)0x0) {
    pMVar10 = MCInst_getOperand(MI,4);
    uVar6 = MCOperand_getReg(pMVar10);
    SStream_concat(O,", %s",getRegisterName_AsmStrsNoRegAltName +
                            *(ushort *)
                             (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 2));
    pcVar3 = MI->csh;
    if (pcVar3->detail != CS_OPT_OFF) {
      uVar8 = MCInst_getOpcode(MI);
      cVar7 = get_op_access(pcVar3,uVar8,(uint)MI->ac_idx);
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar7;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar6;
LAB_001e743b:
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  return;
}

Assistant:

void AArch64_printInst(MCInst *MI, SStream *O, void *Info)
{
	// Check for special encodings and print the canonical alias instead.
	unsigned Opcode = MCInst_getOpcode(MI);
	int LSB;
	int Width;
	char *mnem;

	if (Opcode == AArch64_SYSxt && printSysAlias(MI, O))
		return;

	// SBFM/UBFM should print to a nicer aliased form if possible.
	if (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri ||
			Opcode == AArch64_UBFMXri || Opcode == AArch64_UBFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0);
		MCOperand *Op1 = MCInst_getOperand(MI, 1);
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		MCOperand *Op3 = MCInst_getOperand(MI, 3);

		bool IsSigned = (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri);
		bool Is64Bit = (Opcode == AArch64_SBFMXri || Opcode == AArch64_UBFMXri);

		if (MCOperand_isImm(Op2) && MCOperand_getImm(Op2) == 0 && MCOperand_isImm(Op3)) {
			const char *AsmMnemonic = NULL;

			switch (MCOperand_getImm(Op3)) {
				default:
					break;
				case 7:
					if (IsSigned)
						AsmMnemonic = "sxtb";
					else if (!Is64Bit)
						AsmMnemonic = "uxtb";
					break;
				case 15:
					if (IsSigned)
						AsmMnemonic = "sxth";
					else if (!Is64Bit)
						AsmMnemonic = "uxth";
					break;
				case 31:
					// *xtw is only valid for signed 64-bit operations.
					if (Is64Bit && IsSigned)
						AsmMnemonic = "sxtw";
					break;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(getWRegFromXReg(MCOperand_getReg(Op1)), AArch64_NoRegAltName));

				if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
					uint8_t access;
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = getWRegFromXReg(MCOperand_getReg(Op1));
					MI->flat_insn->detail->arm64.op_count++;
				}

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				return;
			}
		}

		// All immediate shifts are aliases, implemented using the Bitfield
		// instruction. In all cases the immediate shift amount shift must be in
		// the range 0 to (reg.size -1).
		if (MCOperand_isImm(Op2) && MCOperand_isImm(Op3)) {
			const char *AsmMnemonic = NULL;
			int shift = 0;
			int immr = (int)MCOperand_getImm(Op2);
			int imms = (int)MCOperand_getImm(Op3);

			if (Opcode == AArch64_UBFMWri && imms != 0x1F && ((imms + 1) == immr)) {
				AsmMnemonic = "lsl";
				shift = 31 - imms;
			} else if (Opcode == AArch64_UBFMXri && imms != 0x3f &&
					((imms + 1 == immr))) {
				AsmMnemonic = "lsl";
				shift = 63 - imms;
			} else if (Opcode == AArch64_UBFMWri && imms == 0x1f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_UBFMXri && imms == 0x3f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMWri && imms == 0x1f) {
				AsmMnemonic = "asr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMXri && imms == 0x3f) {
				AsmMnemonic = "asr";
				shift = immr;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s, ", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));

				printInt32Bang(O, shift);

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
					uint8_t access;
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
					MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = shift;
					MI->flat_insn->detail->arm64.op_count++;
				}

				return;
			}
		}

		// SBFIZ/UBFIZ aliases
		if (MCOperand_getImm(Op2) > MCOperand_getImm(Op3)) {
			SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfiz" : "ubfiz"),
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
			printInt32Bang(O, (int)((Is64Bit ? 64 : 32) - MCOperand_getImm(Op2)));
			SStream_concat0(O, ", ");
			printInt32Bang(O, (int)MCOperand_getImm(Op3) + 1);

			MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfiz" : "ubfiz"));

			if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
				uint8_t access;
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (Is64Bit ? 64 : 32) - (int)MCOperand_getImm(Op2);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op3) + 1;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		// Otherwise SBFX/UBFX is the preferred form
		SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfx" : "ubfx"),
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
		printInt32Bang(O, (int)MCOperand_getImm(Op2));
		SStream_concat0(O, ", ");
		printInt32Bang(O, (int)MCOperand_getImm(Op3) - (int)MCOperand_getImm(Op2) + 1);

		MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfx" : "ubfx"));

		if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op2);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op3) - MCOperand_getImm(Op2) + 1;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	if (Opcode == AArch64_BFMXri || Opcode == AArch64_BFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0); // Op1 == Op0
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		int ImmR = (int)MCOperand_getImm(MCInst_getOperand(MI, 3));
		int ImmS = (int)MCOperand_getImm(MCInst_getOperand(MI, 4));

		// BFI alias
		if (ImmS < ImmR) {
			int BitWidth = Opcode == AArch64_BFMXri ? 64 : 32;
			LSB = (BitWidth - ImmR) % BitWidth;
			Width = ImmS + 1;

			SStream_concat(O, "bfi\t%s, %s, ",
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
			printInt32Bang(O, LSB);
			SStream_concat0(O, ", ");
			printInt32Bang(O, Width);
			MCInst_setOpcodePub(MI, AArch64_map_insn("bfi"));

			if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
				uint8_t access;
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		LSB = ImmR;
		Width = ImmS - ImmR + 1;
		// Otherwise BFXIL the preferred form
		SStream_concat(O, "bfxil\t%s, %s, ",
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
		printInt32Bang(O, LSB);
		SStream_concat0(O, ", ");
		printInt32Bang(O, Width);
		MCInst_setOpcodePub(MI, AArch64_map_insn("bfxil"));

		if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	mnem = printAliasInstr(MI, O, Info);
	if (mnem) {
		MCInst_setOpcodePub(MI, AArch64_map_insn(mnem));
		cs_mem_free(mnem);
	} else {
		printInstruction(MI, O, Info);
	}
}